

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int moveto_node(lyxp_set *set,lyd_node *cur_node,char *qname,uint16_t qname_len,int options)

{
  ly_ctx *ctx_00;
  char *pcVar1;
  lyxp_node_type local_6c;
  ly_ctx *plStack_68;
  lyxp_node_type root_type;
  ly_ctx *ctx;
  lyd_node *sub;
  lys_module *moveto_mod;
  char *name_dict;
  char *ptr;
  int ret;
  int pref_len;
  int replaced;
  uint32_t i;
  int options_local;
  uint16_t qname_len_local;
  char *qname_local;
  lyd_node *cur_node_local;
  lyxp_set *set_local;
  
  moveto_mod = (lys_module *)0x0;
  if ((set == (lyxp_set *)0x0) || (set->type == LYXP_SET_EMPTY)) {
    set_local._4_4_ = 0;
  }
  else {
    replaced = options;
    i._2_2_ = qname_len;
    _options_local = qname;
    qname_local = (char *)cur_node;
    cur_node_local = (lyd_node *)set;
    if (cur_node == (lyd_node *)0x0) {
      __assert_fail("cur_node",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x151f,
                    "int moveto_node(struct lyxp_set *, struct lyd_node *, const char *, uint16_t, int)"
                   );
    }
    ctx_00 = cur_node->schema->module->ctx;
    plStack_68 = ctx_00;
    if (set->type == LYXP_SET_NODE_SET) {
      moveto_get_root(cur_node,options,&local_6c);
      name_dict = strnchr(_options_local,0x3a,(uint)i._2_2_);
      if (name_dict == (char *)0x0) {
        if ((*_options_local == '*') && (i._2_2_ == 1)) {
          sub = (lyd_node *)0x0;
        }
        else {
          sub = (lyd_node *)lyd_node_module((lyd_node *)qname_local);
        }
      }
      else {
        ptr._4_4_ = (int)name_dict - (int)_options_local;
        sub = (lyd_node *)
              moveto_resolve_model
                        (_options_local,(uint16_t)ptr._4_4_,plStack_68,(lys_node *)0x0,1,0);
        if ((lys_module *)sub == (lys_module *)0x0) {
          ly_vlog(plStack_68,LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,(ulong)ptr._4_4_,
                  _options_local);
          return -1;
        }
        _options_local = _options_local + (int)(ptr._4_4_ + 1);
        i._2_2_ = i._2_2_ - ((short)ptr._4_4_ + 1);
      }
      moveto_mod = (lys_module *)lydict_insert(plStack_68,_options_local,(ulong)i._2_2_);
      pref_len = 0;
      while ((uint)pref_len < *(uint *)&cur_node_local->prev) {
        ret = 0;
        if ((*(int *)(&cur_node_local->attr->next + (ulong)(uint)pref_len * 2) == 1) ||
           (*(int *)(&cur_node_local->attr->next + (ulong)(uint)pref_len * 2) == 0)) {
          for (ctx = (ly_ctx *)(&cur_node_local->attr->parent)[(ulong)(uint)pref_len * 2];
              ctx != (ly_ctx *)0x0; ctx = *(ly_ctx **)((long)&(ctx->dict).lock + 0x10)) {
            ptr._0_4_ = moveto_node_check((lyd_node *)ctx,local_6c,(char *)moveto_mod,
                                          (lys_module *)sub,replaced);
            if ((int)ptr == 0) {
              if (ret == 0) {
                set_replace_node((lyxp_set *)cur_node_local,(lyd_node *)ctx,0,LYXP_NODE_ELEM,
                                 pref_len);
                ret = 1;
              }
              else {
                set_insert_node((lyxp_set *)cur_node_local,(lyd_node *)ctx,0,LYXP_NODE_ELEM,pref_len
                               );
              }
              pref_len = pref_len + 1;
            }
            else if ((int)ptr == 1) {
              lydict_remove(plStack_68,(char *)moveto_mod);
              return 1;
            }
          }
        }
        else if ((((&cur_node_local->attr->parent)[(ulong)(uint)pref_len * 2]->validity & 0x80) == 0
                 ) && (((&cur_node_local->attr->parent)[(ulong)(uint)pref_len * 2]->schema->nodetype
                       & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)) {
          for (ctx = (ly_ctx *)(&cur_node_local->attr->parent)[(ulong)(uint)pref_len * 2]->child;
              ctx != (ly_ctx *)0x0; ctx = *(ly_ctx **)((long)&(ctx->dict).lock + 0x10)) {
            ptr._0_4_ = moveto_node_check((lyd_node *)ctx,local_6c,(char *)moveto_mod,
                                          (lys_module *)sub,replaced);
            if ((int)ptr == 0) {
              if (ret == 0) {
                set_replace_node((lyxp_set *)cur_node_local,(lyd_node *)ctx,0,LYXP_NODE_ELEM,
                                 pref_len);
                ret = 1;
              }
              else {
                set_insert_node((lyxp_set *)cur_node_local,(lyd_node *)ctx,0,LYXP_NODE_ELEM,pref_len
                               );
              }
              pref_len = pref_len + 1;
            }
            else if ((int)ptr == 1) {
              lydict_remove(plStack_68,(char *)moveto_mod);
              return 1;
            }
          }
        }
        if (ret == 0) {
          set_remove_node((lyxp_set *)cur_node_local,pref_len);
        }
      }
      lydict_remove(plStack_68,(char *)moveto_mod);
      set_local._4_4_ = 0;
    }
    else {
      pcVar1 = print_set_type(set);
      ly_vlog(ctx_00,LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar1);
      set_local._4_4_ = -1;
    }
  }
  return set_local._4_4_;
}

Assistant:

static int
moveto_node(struct lyxp_set *set, struct lyd_node *cur_node, const char *qname, uint16_t qname_len, int options)
{
    uint32_t i;
    int replaced, pref_len, ret;
    const char *ptr, *name_dict = NULL; /* optimalization - so we can do (==) instead (!strncmp(...)) in moveto_node_check() */
    struct lys_module *moveto_mod;
    struct lyd_node *sub;
    struct ly_ctx *ctx;
    enum lyxp_node_type root_type;

    if (!set || (set->type == LYXP_SET_EMPTY)) {
        return EXIT_SUCCESS;
    }

    assert(cur_node);
    ctx = cur_node->schema->module->ctx;

    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(ctx, LYE_XPATH_INOP_1, LY_VLOG_NONE, NULL, "path operator", print_set_type(set));
        return -1;
    }

    moveto_get_root(cur_node, options, &root_type);

    /* prefix */
    if ((ptr = strnchr(qname, ':', qname_len))) {
        /* specific module */
        pref_len = ptr - qname;
        moveto_mod = moveto_resolve_model(qname, pref_len, ctx, NULL, 1, 0);
        if (!moveto_mod) {
            LOGVAL(ctx, LYE_XPATH_INMOD, LY_VLOG_NONE, NULL, pref_len, qname);
            return -1;
        }
        qname += pref_len + 1;
        qname_len -= pref_len + 1;
    } else if ((qname[0] == '*') && (qname_len == 1)) {
        /* all modules - special case */
        moveto_mod = NULL;
    } else {
        /* content node module */
        moveto_mod = lyd_node_module(cur_node);
    }

    /* name */
    name_dict = lydict_insert(ctx, qname, qname_len);

    for (i = 0; i < set->used; ) {
        replaced = 0;

        if ((set->val.nodes[i].type == LYXP_NODE_ROOT_CONFIG) || (set->val.nodes[i].type == LYXP_NODE_ROOT)) {
            LY_TREE_FOR(set->val.nodes[i].node, sub) {
                ret = moveto_node_check(sub, root_type, name_dict, moveto_mod, options);
                if (!ret) {
                    /* pos filled later */
                    if (!replaced) {
                        set_replace_node(set, sub, 0, LYXP_NODE_ELEM, i);
                        replaced = 1;
                    } else {
                        set_insert_node(set, sub, 0, LYXP_NODE_ELEM, i);
                    }
                    ++i;
                } else if (ret == EXIT_FAILURE) {
                    lydict_remove(ctx, name_dict);
                    return EXIT_FAILURE;
                }
            }

        /* skip nodes without children - leaves, leaflists, anyxmls, and dummy nodes (ouput root will eval to true) */
        } else if (!(set->val.nodes[i].node->validity & LYD_VAL_INUSE)
                && !(set->val.nodes[i].node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA))) {

            LY_TREE_FOR(set->val.nodes[i].node->child, sub) {
                ret = moveto_node_check(sub, root_type, name_dict, moveto_mod, options);
                if (!ret) {
                    if (!replaced) {
                        set_replace_node(set, sub, 0, LYXP_NODE_ELEM, i);
                        replaced = 1;
                    } else {
                        set_insert_node(set, sub, 0, LYXP_NODE_ELEM, i);
                    }
                    ++i;
                } else if (ret == EXIT_FAILURE) {
                    lydict_remove(ctx, name_dict);
                    return EXIT_FAILURE;
                }
            }
        }

        if (!replaced) {
            /* no match */
            set_remove_node(set, i);
        }
    }
    lydict_remove(ctx, name_dict);

    return EXIT_SUCCESS;
}